

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

pair<int,_int> subprocess::util::pipe_cloexec(void)

{
  long lVar1;
  pair<int,_int> pVar2;
  int iVar3;
  OSError *this;
  int *piVar4;
  long in_FS_OFFSET;
  allocator<char> local_49;
  string local_48;
  int pipe_fds [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = pipe(pipe_fds);
  if (iVar3 == 0) {
    set_clo_on_exec(pipe_fds[0],true);
    set_clo_on_exec(pipe_fds[1],true);
    pVar2.second = pipe_fds[1];
    pVar2.first = pipe_fds[0];
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return pVar2;
    }
  }
  else {
    this = (OSError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"pipe failure",&local_49)
    ;
    piVar4 = __errno_location();
    OSError::OSError(this,&local_48,*piVar4);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&OSError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static inline
  std::pair<int, int> pipe_cloexec() noexcept(false)
  {
    int pipe_fds[2];
    int res = pipe(pipe_fds);
    if (res) {
      throw OSError("pipe failure", errno);
    }

    set_clo_on_exec(pipe_fds[0]);
    set_clo_on_exec(pipe_fds[1]);

    return std::make_pair(pipe_fds[0], pipe_fds[1]);
  }